

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

int bb_serial_read(int pi,uint user_gpio,void *buf,size_t bufSize)

{
  int sent;
  
  sent = pigpio_command(pi,0x2b,user_gpio,(int)bufSize,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,(int)bufSize,sent);
  }
  _pmu(pi);
  return sent;
}

Assistant:

int bb_serial_read(int pi, unsigned user_gpio, void *buf, size_t bufSize)
{
   int bytes;

   bytes = pigpio_command(pi, PI_CMD_SLR, user_gpio, bufSize, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, bufSize, bytes);
   }

   _pmu(pi);

   return bytes;
}